

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O0

int mriStep_TakeStep(void *arkode_mem,realtype *dsmPtr,int *nflagPtr)

{
  int iVar1;
  int iVar2;
  ARKodeMRIStepMem step_mem_00;
  undefined4 *in_RDX;
  undefined8 *in_RSI;
  int retval;
  int is;
  ARKodeMRIStepMem step_mem;
  ARKodeMem ark_mem;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  char *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  uint is_00;
  ARKodeMem in_stack_ffffffffffffffd0;
  ARKodeMem in_stack_ffffffffffffffd8;
  
  *in_RDX = 0;
  *in_RSI = 0;
  iVar1 = mriStep_AccessStepMem
                    ((void *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                     in_stack_ffffffffffffffc0,
                     (ARKodeMem *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                     (ARKodeMRIStepMem *)0xeb76e5);
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar2 = 0;
  if ((in_stack_ffffffffffffffd0->step_attachmasssol != (ARKTimestepAttachMasssolFn)0x0) &&
     (*(long *)(*(long *)(in_stack_ffffffffffffffd0->step_attachmasssol + 8) + 0x10) != 0)) {
    N_VConst((realtype)in_stack_ffffffffffffffc0,
             (N_Vector)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    iVar2 = SUNNonlinSolSetup((SUNNonlinearSolver)in_stack_ffffffffffffffd0,
                              (N_Vector)CONCAT44(in_stack_ffffffffffffffcc,iVar1),
                              in_stack_ffffffffffffffc0);
    if (iVar2 < 0) {
      return -0x1e;
    }
    if (0 < iVar2) {
      return -0x1f;
    }
  }
  is_00 = 1;
  do {
    if (*(int *)&in_stack_ffffffffffffffd0->VRabstol <= (int)is_00) {
      if (in_stack_ffffffffffffffd8->report != 0) {
        fprintf((FILE *)in_stack_ffffffffffffffd8->diagfp,"MRIStep  etest  %li  %.16g  %.16g\n",
                in_stack_ffffffffffffffd8->h,*in_RSI,in_stack_ffffffffffffffd8->nst);
      }
      return 0;
    }
    in_stack_ffffffffffffffd8->tcur =
         *(double *)
          (*(long *)(*(long *)&in_stack_ffffffffffffffd0->atolmin0 + 0x10) + (long)(int)is_00 * 8) *
         in_stack_ffffffffffffffd8->h + in_stack_ffffffffffffffd8->tn;
    if (in_stack_ffffffffffffffd8->report != 0) {
      fprintf((FILE *)in_stack_ffffffffffffffd8->diagfp,"MRIStep  step  %li  %.16g  %i  %.16g\n",
              in_stack_ffffffffffffffd8->h,in_stack_ffffffffffffffd8->tcur,
              in_stack_ffffffffffffffd8->nst,(ulong)is_00);
    }
    step_mem_00 = (ARKodeMRIStepMem)
                  (ulong)*(uint *)(in_stack_ffffffffffffffd0->efun + (long)(int)is_00 * 4);
    switch(step_mem_00) {
    case (ARKodeMRIStepMem)0x0:
      iVar2 = mriStep_StageERKFast
                        (in_stack_ffffffffffffffd8,(ARKodeMRIStepMem)in_stack_ffffffffffffffd0,is_00
                        );
      break;
    case (ARKodeMRIStepMem)0x1:
      iVar2 = mriStep_StageERKNoFast
                        ((ARKodeMem)CONCAT44(is_00,iVar2),step_mem_00,in_stack_ffffffffffffffbc);
      break;
    case (ARKodeMRIStepMem)0x2:
      iVar2 = mriStep_StageDIRKNoFast
                        (in_stack_ffffffffffffffd8,(ARKodeMRIStepMem)in_stack_ffffffffffffffd0,is_00
                         ,(int *)step_mem_00);
      break;
    case (ARKodeMRIStepMem)0x3:
      iVar2 = mriStep_StageDIRKFast
                        (in_stack_ffffffffffffffd0,(ARKodeMRIStepMem)CONCAT44(is_00,iVar2),0,
                         (int *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    }
    if (iVar2 != 0) {
      return iVar2;
    }
    if (in_stack_ffffffffffffffd8->ProcessStage != (ARKPostProcessFn)0x0) {
      iVar1 = (*in_stack_ffffffffffffffd8->ProcessStage)
                        (in_stack_ffffffffffffffd8->tcur,in_stack_ffffffffffffffd8->ycur,
                         in_stack_ffffffffffffffd8->user_data);
      if (iVar1 != 0) {
        return -0x26;
      }
      iVar2 = 0;
    }
    if ((*(int *)(in_stack_ffffffffffffffd0->efun + (long)(int)is_00 * 4) != 0) ||
       (in_stack_ffffffffffffffd8->ProcessStage != (ARKPostProcessFn)0x0)) {
      iVar1 = mriStepInnerStepper_Reset
                        ((MRIStepInnerStepper)CONCAT44(is_00,iVar2),(realtype)step_mem_00,
                         (N_Vector)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      if (iVar1 != 0) {
        return -0x22;
      }
      iVar2 = 0;
    }
    if (((int)is_00 < *(int *)&in_stack_ffffffffffffffd0->VRabstol + -1) &&
       (-1 < *(int *)(*(long *)&in_stack_ffffffffffffffd0->Ratolmin0 + (long)(int)is_00 * 4))) {
      if (in_stack_ffffffffffffffd0->itol != 0) {
        iVar2 = (*(code *)in_stack_ffffffffffffffd0->sunctx)
                          (in_stack_ffffffffffffffd8->tcur,in_stack_ffffffffffffffd8->ycur,
                           *(undefined8 *)
                            ((long)in_stack_ffffffffffffffd0->Sabstol +
                            (long)*(int *)(*(long *)&in_stack_ffffffffffffffd0->Ratolmin0 +
                                          (long)(int)is_00 * 4) * 8),
                           in_stack_ffffffffffffffd8->user_data);
        in_stack_ffffffffffffffd0->h = (realtype)((long)in_stack_ffffffffffffffd0->h + 1);
        if (iVar2 < 0) {
          return -8;
        }
        if (0 < iVar2) {
          return -0xb;
        }
      }
      if (in_stack_ffffffffffffffd0->ritol != 0) {
        if ((*(int *)&in_stack_ffffffffffffffd0->reltol == 0) ||
           (*(int *)(in_stack_ffffffffffffffd0->efun + (long)(int)is_00 * 4) != 2)) {
          iVar2 = (*(code *)in_stack_ffffffffffffffd0->uround)
                            (in_stack_ffffffffffffffd8->tcur,in_stack_ffffffffffffffd8->ycur,
                             (&in_stack_ffffffffffffffd0->Vabstol->content)
                             [*(int *)(*(long *)&in_stack_ffffffffffffffd0->Ratolmin0 +
                                      (long)(int)is_00 * 4)],in_stack_ffffffffffffffd8->user_data);
          in_stack_ffffffffffffffd0->hmin = (realtype)((long)in_stack_ffffffffffffffd0->hmin + 1);
        }
        else {
          N_VLinearSum((realtype)in_stack_ffffffffffffffd0,(N_Vector)CONCAT44(is_00,iVar2),
                       (realtype)step_mem_00,
                       (N_Vector)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                       (N_Vector)0xeb7b78);
        }
        if (iVar2 < 0) {
          return -8;
        }
        if (0 < iVar2) {
          return -0xb;
        }
      }
    }
    is_00 = is_00 + 1;
  } while( true );
}

Assistant:

int mriStep_TakeStep(void* arkode_mem, realtype *dsmPtr, int *nflagPtr)
{
  ARKodeMem ark_mem;           /* outer ARKode memory        */
  ARKodeMRIStepMem step_mem;   /* outer stepper memory       */
  int is;                      /* current stage index        */
  int retval;                  /* reusable return flag       */

  /* initialize algebraic solver convergence flag to success;
     error estimate to zero */
  *nflagPtr = ARK_SUCCESS;
  *dsmPtr = ZERO;

  /* access the MRIStep mem structure */
  retval = mriStep_AccessStepMem(arkode_mem, "mriStep_TakeStep",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) return(retval);

#ifdef SUNDIALS_DEBUG
  printf("    MRIStep step %li,  stage 0,  h = %"RSYM",  t_n = %"RSYM"\n",
         ark_mem->nst, ark_mem->h, ark_mem->tcur);
#endif

#ifdef SUNDIALS_DEBUG_PRINTVEC
    printf("    MRIStep slow stage 0 solution:\n");
    N_VPrint(ark_mem->ycur);
    if (step_mem->explicit_rhs)
    {
      printf("    MRIStep slow stage RHS Fe[0]:\n");
      N_VPrint(step_mem->Fse[0]);
    }
    if (step_mem->implicit_rhs)
    {
      printf("    MRIStep slow stage RHS Fi[0]:\n");
      N_VPrint(step_mem->Fsi[0]);
    }
#endif

  /* call nonlinear solver setup if it exists */
  if (step_mem->NLS)
    if ((step_mem->NLS)->ops->setup) {
      N_VConst(ZERO, ark_mem->tempv3);   /* set guess to 0 for predictor-corrector form */
      retval = SUNNonlinSolSetup(step_mem->NLS, ark_mem->tempv3, ark_mem);
      if (retval < 0) return(ARK_NLS_SETUP_FAIL);
      if (retval > 0) return(ARK_NLS_SETUP_RECVR);
    }

  /* The first stage is the previous time-step solution, so its RHS
     is the [already-computed] slow RHS from the start of the step */

  /* Loop over remaining stages */
  for (is = 1; is < step_mem->stages; is++) {

    /* Set current stage time  */
    ark_mem->tcur = ark_mem->tn + step_mem->MRIC->c[is]*ark_mem->h;

#ifdef SUNDIALS_DEBUG
    printf("    ------------------------------------"
           "----------------------------------------\n");
    printf("    MRIStep step %li,  stage %i,  h = %"RSYM",  t_n = %"RSYM"\n",
           ark_mem->nst, is, ark_mem->h, ark_mem->tcur);
#endif

    /* Solver diagnostics reporting */
    if (ark_mem->report)
      fprintf(ark_mem->diagfp, "MRIStep  step  %li  %"RSYM"  %i  %"RSYM"\n",
              ark_mem->nst, ark_mem->h, is, ark_mem->tcur);

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
    SUNLogger_QueueMsg(ARK_LOGGER, SUN_LOGLEVEL_INFO,
                       "ARKODE::mriStep_TakeStep", "start-step",
                       "step = %li, h = "RSYM", stage = %i, tcur = %"RSYM,
                       ark_mem->nst, ark_mem->h, is, ark_mem->tcur);
#endif

    /* Determine current stage type, and call corresponding routine; the
       vector ark_mem->ycur stores the previous stage solution on input, and
       should store the result of this stage solution on output. */
    switch (step_mem->stagetypes[is]) {
    case(MRISTAGE_ERK_FAST):
      retval = mriStep_StageERKFast(ark_mem, step_mem, is);
      break;
    case(MRISTAGE_ERK_NOFAST):
      retval = mriStep_StageERKNoFast(ark_mem, step_mem, is);
      break;
    case(MRISTAGE_DIRK_NOFAST):
      retval = mriStep_StageDIRKNoFast(ark_mem, step_mem, is, nflagPtr);
      break;
    case(MRISTAGE_DIRK_FAST):
      retval = mriStep_StageDIRKFast(ark_mem, step_mem, is, nflagPtr);
      break;
    }
    if (retval != ARK_SUCCESS)  return(retval);

#ifdef SUNDIALS_DEBUG_PRINTVEC
    printf("    MRIStep slow stage %i solution:\n",is);
    N_VPrint(ark_mem->ycur);
#endif

    /* apply user-supplied stage postprocessing function (if supplied) */
    if (ark_mem->ProcessStage != NULL) {
      retval = ark_mem->ProcessStage(ark_mem->tcur,
                                     ark_mem->ycur,
                                     ark_mem->user_data);
      if (retval != 0) return(ARK_POSTPROCESS_STAGE_FAIL);
    }

    /* conditionally reset the inner integrator with the modified stage solution */
    if ( (step_mem->stagetypes[is] != MRISTAGE_ERK_FAST) ||
         (ark_mem->ProcessStage != NULL) ) {
      retval = mriStepInnerStepper_Reset(step_mem->stepper,
                                         ark_mem->tcur, ark_mem->ycur);
      if (retval != ARK_SUCCESS)  return(ARK_INNERSTEP_FAIL);
    }

    /* Compute updated slow RHS except at last stage which is the new solution.
     * The new solution RHS evaluation happens in arkCompleteStep */
    if (is < step_mem->stages - 1 && step_mem->stage_map[is] > -1) {
      /* store explicit slow rhs */
      if (step_mem->explicit_rhs) {
        retval = step_mem->fse(ark_mem->tcur, ark_mem->ycur,
                               step_mem->Fse[step_mem->stage_map[is]],
                               ark_mem->user_data);
        step_mem->nfse++;
        if (retval < 0)  return(ARK_RHSFUNC_FAIL);
        if (retval > 0)  return(ARK_UNREC_RHSFUNC_ERR);

#ifdef SUNDIALS_DEBUG_PRINTVEC
        printf("    MRIStep slow stage RHS Fe[%i]:\n",is);
        N_VPrint(step_mem->Fse[step_mem->stage_map[is]]);
#endif
      }

      /* store implicit slow rhs  */
      if (step_mem->implicit_rhs) {
        if (!step_mem->deduce_rhs ||
            (step_mem->stagetypes[is] != MRISTAGE_DIRK_NOFAST)) {
          retval = step_mem->fsi(ark_mem->tcur, ark_mem->ycur,
                                 step_mem->Fsi[step_mem->stage_map[is]],
                                 ark_mem->user_data);
          step_mem->nfsi++;
        } else {
          N_VLinearSum(ONE / step_mem->gamma, step_mem->zcor,
                       -ONE / step_mem->gamma, step_mem->sdata,
                       step_mem->Fsi[step_mem->stage_map[is]]);
        }

        if (retval < 0)  return(ARK_RHSFUNC_FAIL);
        if (retval > 0)  return(ARK_UNREC_RHSFUNC_ERR);

#ifdef SUNDIALS_DEBUG_PRINTVEC
        printf("    MRIStep slow stage RHS Fi[%i]:\n",is);
        N_VPrint(step_mem->Fsi[step_mem->stage_map[is]]);
#endif
      }
    } /* compute slow RHS */
  } /* loop over stages */

#ifdef SUNDIALS_DEBUG_PRINTVEC
    printf("    MRIStep updated solution:\n");
    N_VPrint(ark_mem->ycur);
#endif

  /* Solver diagnostics reporting */
  if (ark_mem->report)
    fprintf(ark_mem->diagfp, "MRIStep  etest  %li  %"RSYM"  %"RSYM"\n",
            ark_mem->nst, ark_mem->h, *dsmPtr);

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
  SUNLogger_QueueMsg(ARK_LOGGER, SUN_LOGLEVEL_INFO,
                     "ARKODE::mriStep_TakeStep", "error-test",
                     "step = %li, h = "RSYM", dsm = %"RSYM,
                     ark_mem->nst, ark_mem->h, *dsmPtr);
#endif

  return(ARK_SUCCESS);
}